

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

void add_pax_attr(archive_string *as,char *key,char *value)

{
  int iVar1;
  size_t sVar2;
  char *in_RDX;
  char *in_RSI;
  void *in_RDI;
  char tmp [13];
  int next_ten;
  int len;
  int i;
  int digits;
  undefined4 in_stack_ffffffffffffffc0;
  char local_29;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  char *local_18;
  void *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  sVar2 = strlen(in_RSI);
  iVar1 = (int)sVar2 + 2;
  sVar2 = strlen(local_18);
  local_28 = 1;
  local_1c = 0;
  local_24 = iVar1 + (int)sVar2 + 1;
  for (local_20 = local_24; 0 < local_20; local_20 = local_20 / 10) {
    local_1c = local_1c + 1;
    local_28 = local_28 * 10;
  }
  if (local_28 <= local_24 + local_1c) {
    local_1c = local_1c + 1;
  }
  local_29 = '\0';
  format_int(&local_29,(long)(local_24 + local_1c));
  archive_strcat((archive_string *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),local_8);
  archive_strappend_char
            ((archive_string *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),
             (char)((ulong)local_8 >> 0x38));
  archive_strcat((archive_string *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),local_8);
  archive_strappend_char
            ((archive_string *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),
             (char)((ulong)local_8 >> 0x38));
  archive_strcat((archive_string *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),local_8);
  archive_strappend_char
            ((archive_string *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),
             (char)((ulong)local_8 >> 0x38));
  return;
}

Assistant:

static void
add_pax_attr(struct archive_string *as, const char *key, const char *value)
{
	int digits, i, len, next_ten;
	char tmp[1 + 3 * sizeof(int)];	/* < 3 base-10 digits per byte */

	/*-
	 * PAX attributes have the following layout:
	 *     <len> <space> <key> <=> <value> <nl>
	 */
	len = 1 + (int)strlen(key) + 1 + (int)strlen(value) + 1;

	/*
	 * The <len> field includes the length of the <len> field, so
	 * computing the correct length is tricky.  I start by
	 * counting the number of base-10 digits in 'len' and
	 * computing the next higher power of 10.
	 */
	next_ten = 1;
	digits = 0;
	i = len;
	while (i > 0) {
		i = i / 10;
		digits++;
		next_ten = next_ten * 10;
	}
	/*
	 * For example, if string without the length field is 99
	 * chars, then adding the 2 digit length "99" will force the
	 * total length past 100, requiring an extra digit.  The next
	 * statement adjusts for this effect.
	 */
	if (len + digits >= next_ten)
		digits++;

	/* Now, we have the right length so we can build the line. */
	tmp[sizeof(tmp) - 1] = 0;	/* Null-terminate the work area. */
	archive_strcat(as, format_int(tmp + sizeof(tmp) - 1, len + digits));
	archive_strappend_char(as, ' ');
	archive_strcat(as, key);
	archive_strappend_char(as, '=');
	archive_strcat(as, value);
	archive_strappend_char(as, '\n');
}